

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatasetBuilder.cpp
# Opt level: O0

void __thiscall DatasetBuilder::save(DatasetBuilder *this,path *db_base,string *fname)

{
  bool bVar1;
  pointer this_00;
  ostream *poVar2;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  taints;
  string *filename;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  ofstream of;
  string fname_list;
  string ndx_name;
  unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_> *ndx;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_names;
  path *in_stack_fffffffffffffaf8;
  path *in_stack_fffffffffffffb00;
  path *in_stack_fffffffffffffb08;
  basic_ofstream<char,_std::char_traits<char>_> *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  path *in_stack_fffffffffffffb20;
  path *in_stack_fffffffffffffb28;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb40;
  pointer in_stack_fffffffffffffb48;
  IndexType type;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> local_490 [3];
  reference local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_440;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_438;
  long local_430;
  long local_3a8 [64];
  string local_1a8 [32];
  _Base_ptr local_188;
  undefined1 in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe81;
  string *in_stack_fffffffffffffe88;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  path *in_stack_fffffffffffffea0;
  _Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
  in_stack_fffffffffffffeb0;
  string local_f8 [48];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  reference local_68;
  unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_> *local_60;
  __normal_iterator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_*,_std::vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>_>
  local_58;
  long local_50;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1b9ce9);
  local_50 = in_RDI + 0x38;
  local_58._M_current =
       (unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_> *)
       std::
       vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
       ::begin((vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
                *)in_stack_fffffffffffffaf8);
  local_60 = (unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_> *)
             std::
             vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
             ::end((vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
                    *)in_stack_fffffffffffffaf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_*,_std::vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>_>
                        *)in_stack_fffffffffffffb00,
                       (__normal_iterator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_*,_std::vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>_>
                        *)in_stack_fffffffffffffaf8);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_*,_std::vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>_>
               ::operator*(&local_58);
    type = (IndexType)((ulong)in_stack_fffffffffffffb48 >> 0x20);
    this_00 = std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>::operator->
                        ((unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_> *)0x1b9d64);
    IndexBuilder::index_type(this_00);
    get_index_type_name_abi_cxx11_(type);
    std::operator+(&in_stack_fffffffffffffb08->_M_pathname,(char *)in_stack_fffffffffffffb00);
    std::operator+(&in_stack_fffffffffffffb08->_M_pathname,&in_stack_fffffffffffffb00->_M_pathname);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    in_stack_fffffffffffffb48 =
         std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>::operator->
                   ((unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_> *)0x1b9de9);
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
              (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    std::experimental::filesystem::v1::__cxx11::operator/
              (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    std::experimental::filesystem::v1::__cxx11::path::operator_cast_to_string
              (in_stack_fffffffffffffaf8);
    (*in_stack_fffffffffffffb48->_vptr_IndexBuilder[3])(in_stack_fffffffffffffb48,local_f8);
    std::__cxx11::string::~string(local_f8);
    std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffb00);
    std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffb00);
    pVar3 = std::
            set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::emplace<std::__cxx11::string&>
                      ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    in_stack_fffffffffffffb40 = pVar3.first._M_node;
    in_stack_fffffffffffffe80 = pVar3.second;
    local_188 = in_stack_fffffffffffffb40._M_node;
    std::__cxx11::string::~string(local_88);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_*,_std::vector<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>_>
    ::operator++(&local_58);
  }
  std::operator+((char *)in_stack_fffffffffffffb48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb40._M_node);
  std::ofstream::ofstream(local_3a8);
  std::ios::exceptions((int)local_3a8 + (int)*(undefined8 *)(local_3a8[0] + -0x18));
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  std::experimental::filesystem::v1::__cxx11::operator/
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  std::basic_ofstream<char,_std::char_traits<char>_>::
  open<std::experimental::filesystem::v1::__cxx11::path>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
             (openmode)((ulong)in_stack_fffffffffffffb00 >> 0x20));
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffb00);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffb00);
  local_430 = in_RDI + 0x20;
  local_438._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffaf8);
  local_440 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffaf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffb00,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffaf8);
    if (!bVar1) break;
    local_448 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_438);
    poVar2 = std::operator<<((ostream *)local_3a8,(string *)local_448);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_438);
  }
  std::ostream::flush();
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1ba1d9);
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional(local_490);
  store_dataset(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                in_stack_fffffffffffffe88,
                (optional<std::basic_string_view<char,_std::char_traits<char>_>_>)
                in_stack_fffffffffffffeb0,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT71(in_stack_fffffffffffffe81,in_stack_fffffffffffffe80));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1ba247);
  std::ofstream::~ofstream(local_3a8);
  std::__cxx11::string::~string(local_1a8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1ba26e);
  return;
}

Assistant:

void DatasetBuilder::save(const fs::path &db_base, const std::string &fname) {
    std::set<std::string> index_names;

    for (auto &ndx : indices) {
        std::string ndx_name =
            get_index_type_name(ndx->index_type()) + "." + fname;
        ndx->save(db_base / ndx_name);
        index_names.emplace(ndx_name);
    }

    std::string fname_list = "files." + fname;

    std::ofstream of;
    of.exceptions(std::ofstream::badbit);
    of.open(db_base / fname_list, std::ofstream::binary);

    for (const std::string &filename : fids) {
        of << filename << "\n";
    }
    of.flush();

    std::set<std::string> taints;
    store_dataset(db_base, fname, index_names, fname_list, std::nullopt,
                  taints);
}